

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool (anonymous_namespace)::AddBundleExecutable<cmInstallTargetGenerator*>
               (Helper *helper,cmInstallRuntimeDependencySet *runtimeDependencySet,
               cmInstallTargetGenerator **bundleExecutable)

{
  bool bVar1;
  long *local_40 [2];
  long local_30 [2];
  
  bVar1 = cmInstallRuntimeDependencySet::AddBundleExecutable
                    (runtimeDependencySet,(cmInstallTargetGenerator *)bundleExecutable);
  if (!bVar1) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"A runtime dependency set may only have one bundle executable.",""
              );
    std::__cxx11::string::_M_assign((string *)&helper->Status->Error);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return bVar1;
}

Assistant:

bool AddBundleExecutable(Helper& helper,
                         cmInstallRuntimeDependencySet* runtimeDependencySet,
                         T&& bundleExecutable)
{
  if (!runtimeDependencySet->AddBundleExecutable(bundleExecutable)) {
    helper.SetError(
      "A runtime dependency set may only have one bundle executable.");
    return false;
  }
  return true;
}